

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O0

string * reverseWords(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  ulong local_28;
  size_t i;
  int end;
  int begin;
  string *s_local;
  
  i._4_4_ = 0;
  i._0_4_ = -1;
  local_28 = 0;
  _end = s;
  s_local = __return_storage_ptr__;
  while( true ) {
    uVar1 = local_28;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == ' ') {
      i._0_4_ = (int)local_28;
      local_38._M_current = (char *)std::__cxx11::string::begin();
      local_30 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_38,(long)i._4_4_);
      local_48._M_current = (char *)std::__cxx11::string::begin();
      local_40 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_48,(long)(int)i);
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_40);
      i._4_4_ = (int)i + 1;
    }
    local_28 = local_28 + 1;
  }
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_58,(long)i._4_4_);
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(local_50,__last);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

string reverseWords(string s) {
    int begin=0,end=-1;
    for (size_t i=0;i<s.size();i++)
    {
        if (s[i]==' ')
        {
            end = i;
            reverse(s.begin()+begin,s.begin()+end);
            begin = end+1;
        }
    }
    reverse(s.begin()+begin,s.end());
    return s;
}